

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs_internal_test.c
# Opt level: O3

uint main(void)

{
  ulong uVar1;
  undefined4 *puVar2;
  void *pvVar3;
  uint *puVar4;
  uint *G;
  uint *__ptr;
  undefined8 *puVar5;
  undefined8 *__ptr_00;
  undefined8 *__ptr_01;
  ulong uVar6;
  uint uVar7;
  char *pcVar8;
  char *__format;
  bool bVar9;
  uint actual_len;
  uint a_len;
  uint local_44;
  undefined8 *local_40;
  uint local_34;
  
  generate_gf();
  puVar2 = (undefined4 *)calloc(5,4);
  *puVar2 = 0x74;
  puVar2[1] = 0xe7;
  puVar2[2] = 0xd8;
  puVar2[3] = 0x1e;
  puVar2[4] = 1;
  uVar1 = 0;
  do {
    uVar6 = uVar1;
    if (uVar6 == 4) break;
    uVar1 = uVar6 + 1;
  } while ((&DAT_00104144)[uVar6] == puVar2[uVar6 + 1]);
  test_n = test_n + 1;
  __format = "test %d failed\n";
  pcVar8 = "test %d passed\n";
  if (uVar6 < 4) {
    pcVar8 = "test %d failed\n";
  }
  printf(pcVar8);
  total = total + (uVar6 < 4);
  test_n = test_n + 1;
  printf("test %d passed\n");
  free(puVar2);
  test_n = test_n + 1;
  printf("test %d passed\n");
  test_n = test_n + 1;
  printf("test %d passed\n");
  pvVar3 = calloc(6,4);
  *(undefined8 *)((long)pvVar3 + 0x10) = 0x6900000068;
  uVar1 = 0;
  do {
    uVar6 = uVar1;
    if (uVar6 == 5) break;
    uVar1 = uVar6 + 1;
  } while ((&DAT_00104164)[uVar6] == *(int *)((long)pvVar3 + uVar6 * 4 + 4));
  test_n = test_n + 1;
  pcVar8 = "test %d passed\n";
  if (uVar6 < 5) {
    pcVar8 = "test %d failed\n";
  }
  printf(pcVar8);
  total = total + (uVar6 < 5);
  free(pvVar3);
  pvVar3 = calloc(4,4);
  *(undefined8 *)((long)pvVar3 + 8) = 0x6900000068;
  uVar1 = 0;
  do {
    uVar6 = uVar1;
    if (uVar6 == 3) break;
    uVar1 = uVar6 + 1;
  } while ((&DAT_00104024)[uVar6] == *(int *)((long)pvVar3 + uVar6 * 4 + 4));
  test_n = test_n + 1;
  pcVar8 = "test %d passed\n";
  if (uVar6 < 3) {
    pcVar8 = "test %d failed\n";
  }
  printf(pcVar8);
  total = total + (uVar6 < 3);
  free(pvVar3);
  puVar4 = (uint *)calloc(6,4);
  puVar4[4] = 0x68;
  puVar4[5] = 0x69;
  G = (uint *)calloc(5,4);
  G[0] = 0x74;
  G[1] = 0xe7;
  G[2] = 0xd8;
  G[3] = 0x1e;
  G[4] = 1;
  local_34 = 0;
  __ptr = calculate_check_symbols(puVar4,6,G,5,2,&local_34);
  if (*__ptr == 0x45) {
    uVar1 = 0;
    do {
      uVar6 = uVar1;
      if (uVar6 == 5) break;
      uVar1 = uVar6 + 1;
    } while ((&DAT_00104184)[uVar6] == __ptr[uVar6 + 1]);
    uVar7 = (uint)(uVar6 < 5);
    __format = "test %d failed\n";
    if (uVar6 >= 5) {
      __format = "test %d passed\n";
    }
  }
  else {
    uVar7 = 1;
  }
  test_n = test_n + 1;
  printf(__format);
  total = total + uVar7;
  free(G);
  free(__ptr);
  free(puVar4);
  local_44 = 0;
  puVar4 = calculate_syndrome((uint *)&DAT_001041a0,6,2,&local_44);
  if (*puVar4 == 0x82) {
    uVar1 = 0;
    do {
      uVar6 = uVar1;
      if (uVar6 == 3) break;
      uVar1 = uVar6 + 1;
    } while (puVar4[uVar6 + 1] == (&DAT_00104034)[uVar6]);
    uVar7 = (uint)(uVar6 < 3);
    pcVar8 = "test %d failed\n";
    if (uVar6 >= 3) {
      pcVar8 = "test %d passed\n";
    }
  }
  else {
    pcVar8 = "test %d failed\n";
    uVar7 = 1;
  }
  test_n = test_n + 1;
  printf(pcVar8);
  total = total + uVar7;
  test_n = test_n + 1;
  bVar9 = local_44 != 4;
  pcVar8 = "test %d passed\n";
  if (bVar9) {
    pcVar8 = "test %d failed\n";
  }
  printf(pcVar8);
  total = total + bVar9;
  free(puVar4);
  puVar5 = (undefined8 *)calloc(5,4);
  *puVar5 = 0xe700000074;
  puVar5[1] = 0x1e000000d8;
  *(undefined4 *)(puVar5 + 2) = 1;
  __ptr_00 = (undefined8 *)calloc(5,4);
  *__ptr_00 = 0xe700000074;
  __ptr_00[1] = 0x1e000000d8;
  *(undefined4 *)(__ptr_00 + 2) = 1;
  __ptr_01 = (undefined8 *)calloc(5,4);
  *__ptr_01 = 0xe700000074;
  __ptr_01[1] = 0x1e000000d8;
  *(undefined4 *)(__ptr_01 + 2) = 1;
  puVar2 = (undefined4 *)calloc(5,4);
  *puVar2 = 0x74;
  puVar2[1] = 0xe7;
  puVar2[2] = 0xd8;
  puVar2[3] = 0x1e;
  puVar2[4] = 1;
  uVar1 = 0;
  do {
    uVar6 = uVar1;
    if (uVar6 == 4) break;
    uVar1 = uVar6 + 1;
  } while (*(int *)((long)puVar5 + uVar6 * 4 + 4) == *(int *)((long)__ptr_00 + uVar6 * 4 + 4));
  test_n = test_n + 1;
  pcVar8 = "test %d passed\n";
  if (uVar6 < 4) {
    pcVar8 = "test %d failed\n";
  }
  local_40 = puVar5;
  printf(pcVar8);
  total = total + (uVar6 < 4);
  uVar1 = 0;
  do {
    uVar6 = uVar1;
    if (uVar6 == 4) break;
    uVar1 = uVar6 + 1;
  } while (*(int *)((long)__ptr_00 + uVar6 * 4 + 4) == *(int *)((long)__ptr_01 + uVar6 * 4 + 4));
  test_n = test_n + 1;
  pcVar8 = "test %d passed\n";
  if (uVar6 < 4) {
    pcVar8 = "test %d failed\n";
  }
  printf(pcVar8);
  total = total + (uVar6 < 4);
  uVar1 = 0;
  do {
    uVar6 = uVar1;
    if (uVar6 == 4) break;
    uVar1 = uVar6 + 1;
  } while (*(int *)((long)__ptr_01 + uVar6 * 4 + 4) == puVar2[uVar6 + 1]);
  test_n = test_n + 1;
  pcVar8 = "test %d passed\n";
  if (uVar6 < 4) {
    pcVar8 = "test %d failed\n";
  }
  printf(pcVar8);
  puVar5 = local_40;
  total = total + (uVar6 < 4);
  uVar1 = 0;
  do {
    uVar6 = uVar1;
    if (uVar6 == 4) break;
    uVar1 = uVar6 + 1;
  } while (puVar2[uVar6 + 1] == *(int *)((long)local_40 + uVar6 * 4 + 4));
  test_n = test_n + 1;
  pcVar8 = "test %d passed\n";
  if (uVar6 < 4) {
    pcVar8 = "test %d failed\n";
  }
  printf(pcVar8);
  uVar7 = total + (uVar6 < 4);
  total = uVar7;
  free(puVar5);
  free(__ptr_00);
  free(__ptr_01);
  free(puVar2);
  return uVar7;
}

Assistant:

uint32_t main()
{
    generate_gf();

    { // generating_polynomial_test t=2
        uint32_t t = 2;
        uint32_t G[] = {116, 231, 216, 30, 1};
        uint32_t g_len = 0;
        uint32_t *g = generating_polynomial(t, &g_len);
        REQUIRE(AR_EQ(G, g, LEN(G)));
        REQUIRE(g_len == LEN(G));
        vector_free(g);
    }

    { // generating_polynomial_test t=1
        uint32_t t = 1;
        uint32_t G[] = {2, 1};
        uint32_t g_len = 0;
        uint32_t *g = generating_polynomial(t, &g_len);
        REQUIRE(AR_EQ(G, g, LEN(G)));
        REQUIRE(g_len == LEN(G));
        vector_free(g);
    }

    { // shift_msg_to_vec t=2
        uint32_t t = 2;
        uint32_t a[] = {0, 0, 0, 0, 104, 105};
        uint32_t b_len = 0;
        uint32_t *b = shift_msg_to_vec("hi", 2, t, &b_len);
        REQUIRE(AR_EQ(a, b, LEN(a)));
        vector_free(b);
    }

    { // shift_msg_to_vec t=1
        uint32_t t = 1;
        uint32_t a[] = {0, 0, 104, 105};
        uint32_t b_len = 0;
        uint32_t *b = shift_msg_to_vec("hi", 2, t, &b_len);
        REQUIRE(AR_EQ(a, b, LEN(a)));
        vector_free(b);
    }

    { // calculate_check_symbols t=2
        uint32_t t = 2;
        uint32_t v[] = {69, 211, 228, 205, 0, 0};
        uint32_t m_len = 0;
        uint32_t *M = shift_msg_to_vec("hi", 2, t, &m_len);
        uint32_t g_len = 0;
        uint32_t *G = generating_polynomial(t, &g_len);
        uint32_t a_len = 0;
        uint32_t *a = calculate_check_symbols(M, m_len, G, g_len, t, &a_len);
        REQUIRE(AR_EQ(v, a, LEN(v)));
        vector_free(G);
        vector_free(a);
        vector_free(M);
    }

    { // calculate syndrome test
        uint32_t t = 2;
        uint32_t expected[] = {130, 153, 245, 88};
        uint32_t c1[] = {192, 211, 44, 205, 104, 105};
        uint32_t actual_len = 0;
        uint32_t *actual = calculate_syndrome(c1, LEN(c1), t, &actual_len);
        REQUIRE(AR_EQ(actual, expected, LEN(expected)));
        REQUIRE(actual_len == LEN(expected));
        vector_free(actual);
    }

    { // generator test
        uint32_t t = 2;
        uint32_t size = 0;
        uint32_t *q = generating_polynomial(t, &size);
        uint32_t *w = generating_polynomial(t, NULL);
        uint32_t *e = generating_polynomial(t, NULL);
        uint32_t *r = generating_polynomial(t, NULL);

        REQUIRE(AR_EQ(q,w,size));
        REQUIRE(AR_EQ(w,e,size));
        REQUIRE(AR_EQ(e,r,size));
        REQUIRE(AR_EQ(r,q,size));

        vector_free(q);
        vector_free(w);
        vector_free(e);
        vector_free(r);
    }

    TEST_EXIT;
}